

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

int32_t __thiscall icu_63::CollationRuleParser::skipWhiteSpace(CollationRuleParser *this,int32_t i)

{
  short sVar1;
  UBool UVar2;
  UnicodeString *pUVar3;
  char16_t *pcVar4;
  uint uVar5;
  uint uVar6;
  uint c;
  long lVar7;
  
  pUVar3 = this->rules;
  sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
  uVar5 = (uint)sVar1;
  if (sVar1 < 0) {
    uVar6 = (pUVar3->fUnion).fFields.fLength;
  }
  else {
    uVar6 = (int)uVar5 >> 5;
  }
  if (i < (int)uVar6) {
    lVar7 = (long)i;
    do {
      c = 0xffff;
      if ((uint)i < uVar6) {
        if ((uVar5 & 2) == 0) {
          pcVar4 = (pUVar3->fUnion).fFields.fArray;
        }
        else {
          pcVar4 = (char16_t *)((long)&pUVar3->fUnion + 2);
        }
        c = (uint)(ushort)pcVar4[lVar7];
      }
      UVar2 = PatternProps::isWhiteSpace(c);
      if (UVar2 == '\0') {
        return i;
      }
      pUVar3 = this->rules;
      sVar1 = (pUVar3->fUnion).fStackFields.fLengthAndFlags;
      uVar5 = (uint)sVar1;
      if (sVar1 < 0) {
        uVar6 = (pUVar3->fUnion).fFields.fLength;
      }
      else {
        uVar6 = (int)uVar5 >> 5;
      }
      lVar7 = lVar7 + 1;
      i = i + 1;
    } while (lVar7 < (int)uVar6);
  }
  return i;
}

Assistant:

int32_t
CollationRuleParser::skipWhiteSpace(int32_t i) const {
    while(i < rules->length() && PatternProps::isWhiteSpace(rules->charAt(i))) {
        ++i;
    }
    return i;
}